

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClipboardReporter.cpp
# Opt level: O3

bool __thiscall
ApprovalTests::ClipboardReporter::report(ClipboardReporter *this,string *received,string *approved)

{
  bool isWindows;
  string local_38;
  
  isWindows = SystemUtils::isWindowsOs();
  getCommandLineFor(&local_38,received,approved,isWindows);
  copyToClipboard(&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return true;
}

Assistant:

bool ClipboardReporter::report(std::string received, std::string approved) const
    {
        copyToClipboard(
            getCommandLineFor(received, approved, SystemUtils::isWindowsOs()));
        return true;
    }